

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_systemz.c
# Opt level: O2

int main(void)

{
  int iVar1;
  cs_detail *pcVar2;
  size_t count;
  cs_err cVar3;
  char *pcVar4;
  size_t len;
  size_t len_00;
  ulong uVar5;
  size_t sVar6;
  char *__format;
  long *plVar7;
  cs_insn *insn;
  size_t local_38;
  
  cVar3 = cs_open(CS_ARCH_SYSZ,CS_MODE_BIG_ENDIAN,&handle);
  if (cVar3 == CS_ERR_OK) {
    cs_option(handle,CS_OPT_DETAIL,3);
    local_38 = cs_disasm(handle,(uint8_t *)anon_var_dwarf_27,0x2e,0x1000,0,&insn);
    if (local_38 == 0) {
      puts("****************");
      printf("Platform: %s\n","SystemZ");
      print_string_hex(anon_var_dwarf_27,(uchar *)0x2e,len_00);
      puts("ERROR: Failed to disasm given code!");
    }
    else {
      puts("****************");
      printf("Platform: %s\n","SystemZ");
      print_string_hex(anon_var_dwarf_27,(uchar *)0x2e,len);
      puts("Disasm:");
      for (sVar6 = 0; count = local_38, sVar6 != local_38; sVar6 = sVar6 + 1) {
        printf("0x%lx:\t%s\t%s\n",insn[sVar6].address,insn[sVar6].mnemonic,insn[sVar6].op_str);
        pcVar2 = insn[sVar6].detail;
        if (pcVar2 != (cs_detail *)0x0) {
          if ((pcVar2->field_6).x86.opcode[0] != '\0') {
            printf("\top_count: %u\n");
          }
          plVar7 = (long *)((long)&pcVar2->field_6 + 0x20);
          for (uVar5 = 0; uVar5 < (pcVar2->field_6).x86.opcode[0]; uVar5 = uVar5 + 1) {
            iVar1 = (int)plVar7[-3];
            if (iVar1 == 0x40) {
              printf("\t\toperands[%u].type: ACREG = %u\n",uVar5 & 0xffffffff,
                     (ulong)*(uint *)(plVar7 + -2));
              goto LAB_00142478;
            }
            if (iVar1 == 2) {
              pcVar4 = (char *)plVar7[-2];
              __format = "\t\toperands[%u].type: IMM = 0x%lx\n";
LAB_0014245a:
              printf(__format,uVar5 & 0xffffffff,pcVar4);
            }
            else if (iVar1 == 3) {
              printf("\t\toperands[%u].type: MEM\n",uVar5 & 0xffffffff);
              if (*(byte *)(plVar7 + -2) != 0) {
                pcVar4 = cs_reg_name(handle,(uint)*(byte *)(plVar7 + -2));
                printf("\t\t\toperands[%u].mem.base: REG = %s\n",uVar5 & 0xffffffff,pcVar4);
              }
              if (*(byte *)((long)plVar7 + -0xf) != 0) {
                pcVar4 = cs_reg_name(handle,(uint)*(byte *)((long)plVar7 + -0xf));
                printf("\t\t\toperands[%u].mem.index: REG = %s\n",uVar5 & 0xffffffff,pcVar4);
              }
              if (plVar7[-1] != 0) {
                printf("\t\t\toperands[%u].mem.length: 0x%lx\n",uVar5 & 0xffffffff);
              }
              pcVar4 = (char *)*plVar7;
              if (pcVar4 != (char *)0x0) {
                __format = "\t\t\toperands[%u].mem.disp: 0x%lx\n";
                goto LAB_0014245a;
              }
            }
            else if (iVar1 == 1) {
              pcVar4 = cs_reg_name(handle,*(uint *)(plVar7 + -2));
              __format = "\t\toperands[%u].type: REG = %s\n";
              goto LAB_0014245a;
            }
LAB_00142478:
            plVar7 = plVar7 + 4;
          }
          if ((pcVar2->field_6).arm64.cc != ARM64_CC_INVALID) {
            printf("\tCode condition: %u\n");
          }
          putchar(10);
        }
      }
      printf("0x%lx:\n",(ulong)insn[local_38 - 1].size + insn[local_38 - 1].address);
      cs_free(insn,count);
    }
    putchar(10);
    cs_close(&handle);
  }
  else {
    printf("Failed on cs_open() with error returned: %u\n",(ulong)cVar3);
  }
  return 0;
}

Assistant:

static void test()
{
#define SYSZ_CODE "\xed\x00\x00\x00\x00\x1a\x5a\x0f\x1f\xff\xc2\x09\x80\x00\x00\x00\x07\xf7\xeb\x2a\xff\xff\x7f\x57\xe3\x01\xff\xff\x7f\x57\xeb\x00\xf0\x00\x00\x24\xb2\x4f\x00\x78\xec\x18\x00\x00\xc1\x7f"

	struct platform platforms[] = {
		{
			CS_ARCH_SYSZ,
			CS_MODE_BIG_ENDIAN,
			(unsigned char*)SYSZ_CODE,
			sizeof(SYSZ_CODE) - 1,
			"SystemZ",
		},
	};

	uint64_t address = 0x1000;
	cs_insn *insn;
	int i;
	size_t count;

	for (i = 0; i < sizeof(platforms)/sizeof(platforms[0]); i++) {
		cs_err err = cs_open(platforms[i].arch, platforms[i].mode, &handle);
		if (err) {
			printf("Failed on cs_open() with error returned: %u\n", err);
			continue;
		}

		cs_option(handle, CS_OPT_DETAIL, CS_OPT_ON);

		count = cs_disasm(handle, platforms[i].code, platforms[i].size, address, 0, &insn);
		if (count) {
			size_t j;

			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code:", platforms[i].code, platforms[i].size);
			printf("Disasm:\n");

			for (j = 0; j < count; j++) {
				printf("0x%"PRIx64":\t%s\t%s\n", insn[j].address, insn[j].mnemonic, insn[j].op_str);
				print_insn_detail(&insn[j]);
			}
			printf("0x%"PRIx64":\n", insn[j-1].address + insn[j-1].size);

			// free memory allocated by cs_disasm()
			cs_free(insn, count);
		} else {
			printf("****************\n");
			printf("Platform: %s\n", platforms[i].comment);
			print_string_hex("Code:", platforms[i].code, platforms[i].size);
			printf("ERROR: Failed to disasm given code!\n");
		}

		printf("\n");

		cs_close(&handle);
	}
}